

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void libtorrent::dht::anon_unknown_20::put_mutable_item_callback
               (item *it,int responses,
               shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> *ctx,
               function<void_(const_libtorrent::dht::item_&,_int)> *cb)

{
  int iVar1;
  element_type *peVar2;
  function<void_(const_libtorrent::dht::item_&,_int)> *cb_local;
  shared_ptr<libtorrent::dht::(anonymous_namespace)::put_item_ctx> *ctx_local;
  int responses_local;
  item *it_local;
  
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ctx);
  peVar2->response_count = responses + peVar2->response_count;
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ctx);
  iVar1 = peVar2->active_traversals + -1;
  peVar2->active_traversals = iVar1;
  if (iVar1 == 0) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::put_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ctx);
    ::std::function<void_(const_libtorrent::dht::item_&,_int)>::operator()
              (cb,it,peVar2->response_count);
  }
  return;
}

Assistant:

void put_mutable_item_callback(item const& it, int responses, std::shared_ptr<put_item_ctx> ctx
		, std::function<void(item const&, int)> cb)
	{
		ctx->response_count += responses;
		if (--ctx->active_traversals == 0)
			cb(it, ctx->response_count);
	}